

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O2

JavascriptBigInt * Js::JavascriptBigInt::Sub(JavascriptBigInt *pbi1,JavascriptBigInt *pbi2)

{
  int iVar1;
  JavascriptBigInt *pJVar2;
  
  if ((pbi1->m_length == 1) && (*(pbi1->m_digits).ptr == 0)) {
    pbi2->m_isNegative = (Type)(pbi2->m_isNegative ^ 1);
    pbi1 = pbi2;
  }
  else if ((pbi2->m_length != 1) || (*(pbi2->m_digits).ptr != 0)) {
    if (pbi2->m_isNegative == true) {
      pbi2->m_isNegative = false;
      pJVar2 = Add(pbi1,pbi2);
      return pJVar2;
    }
    if (pbi1->m_isNegative == true) {
      if (pbi1->m_length < pbi2->m_length) {
        AddAbsolute(pbi2,pbi1);
        pbi1 = pbi2;
      }
      else {
        AddAbsolute(pbi1,pbi2);
      }
    }
    else {
      iVar1 = CompareAbsolute(pbi1,pbi2);
      if (iVar1 == 1) {
        SubAbsolute(pbi1,pbi2);
      }
      else {
        if (iVar1 == 0) {
          pJVar2 = CreateZero((((((pbi1->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                              ->super_JavascriptLibraryBase).scriptContext.ptr);
          return pJVar2;
        }
        pbi2->m_isNegative = true;
        SubAbsolute(pbi2,pbi1);
        pbi1 = pbi2;
      }
    }
  }
  return pbi1;
}

Assistant:

JavascriptBigInt * JavascriptBigInt::Sub(JavascriptBigInt * pbi1, JavascriptBigInt * pbi2)
    {
        if (JavascriptBigInt::IsZero(pbi1))
        {
            pbi2->m_isNegative = !pbi2->m_isNegative;
            return pbi2;
        }
        if (JavascriptBigInt::IsZero(pbi2))
        {
            return pbi1;
        }

        if (pbi2->m_isNegative)
        {
            pbi2->m_isNegative = false;
            return JavascriptBigInt::Add(pbi1, pbi2);// a-(-b)=a+b
        }

        if (pbi1->m_isNegative) // -a-b=-(a+b)
        {
            if (pbi1->m_length >= pbi2->m_length)
            {
                JavascriptBigInt::AddAbsolute(pbi1, pbi2);
                return pbi1;
            }
            JavascriptBigInt::AddAbsolute(pbi2, pbi1);
            return pbi2;
        }
        else // both positive 
        {
            switch (pbi1->CompareAbsolute(pbi2))
            {
            case 0: // a -a = 0
                return JavascriptBigInt::CreateZero(pbi1->GetScriptContext());
            case 1: 
                JavascriptBigInt::SubAbsolute(pbi1, pbi2); // a - b > 0
                return pbi1;
            default:
                pbi2->m_isNegative = true;
                JavascriptBigInt::SubAbsolute(pbi2, pbi1); // a - b = - (b-a) < 0
                return pbi2;
            }
        }
    }